

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall kj::ArrayBuilder<kj::StringTree>::dispose(ArrayBuilder<kj::StringTree> *this)

{
  StringTree *firstElement;
  RemoveConst<kj::StringTree> *pRVar1;
  StringTree *pSVar2;
  StringTree *endCopy;
  StringTree *posCopy;
  StringTree *ptrCopy;
  ArrayBuilder<kj::StringTree> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pSVar2 = this->endPtr;
  if (firstElement != (StringTree *)0x0) {
    this->ptr = (StringTree *)0x0;
    this->pos = (RemoveConst<kj::StringTree> *)0x0;
    this->endPtr = (StringTree *)0x0;
    ArrayDisposer::dispose<kj::StringTree>
              (this->disposer,firstElement,((long)pRVar1 - (long)firstElement) / 0x38,
               ((long)pSVar2 - (long)firstElement) / 0x38);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }